

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O1

AssertionExpr *
slang::ast::ConditionalAssertionExpr::fromSyntax
          (ConditionalPropertyExprSyntax *syntax,ASTContext *context)

{
  Compilation *this;
  int iVar1;
  int iVar2;
  Expression *args;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ConditionalAssertionExpr *pCVar3;
  AssertionExpr *elseExpr;
  AssertionExpr *local_30;
  
  this = ((context->scope).ptr)->compilation;
  args = bindExpr((syntax->condition).ptr,context,false,true);
  iVar1 = AssertionExpr::bind((AssertionExpr *)(syntax->expr).ptr,(int)context,(sockaddr *)0x0,0);
  local_30 = (AssertionExpr *)0x0;
  if (syntax->elseClause != (ElsePropertyClauseSyntax *)0x0) {
    iVar2 = AssertionExpr::bind((AssertionExpr *)(syntax->elseClause->expr).ptr,(int)context,
                                (sockaddr *)0x0,0);
    local_30 = (AssertionExpr *)CONCAT44(extraout_var_00,iVar2);
  }
  pCVar3 = BumpAllocator::
           emplace<slang::ast::ConditionalAssertionExpr,slang::ast::Expression_const&,slang::ast::AssertionExpr_const&,slang::ast::AssertionExpr_const*&>
                     (&this->super_BumpAllocator,args,(AssertionExpr *)CONCAT44(extraout_var,iVar1),
                      &local_30);
  return &pCVar3->super_AssertionExpr;
}

Assistant:

AssertionExpr& ConditionalAssertionExpr::fromSyntax(const ConditionalPropertyExprSyntax& syntax,
                                                    const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto& cond = bindExpr(*syntax.condition, context);
    auto& ifExpr = bind(*syntax.expr, context);

    const AssertionExpr* elseExpr = nullptr;
    if (syntax.elseClause)
        elseExpr = &bind(*syntax.elseClause->expr, context);

    return *comp.emplace<ConditionalAssertionExpr>(cond, ifExpr, elseExpr);
}